

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

void __thiscall
CVmObjFrameRef::restore_from_file
          (CVmObjFrameRef *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  char *pcVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  vm_frameref_ext *pvVar4;
  int iVar5;
  uint nlocals;
  vm_val_t *val;
  char buf [5];
  char b_2 [4];
  short local_42 [3];
  vm_obj_id_t local_3c;
  ulong local_38;
  
  CVmFile::read_bytes(fp,(char *)local_42,2);
  nlocals = (uint)local_42[0];
  CVmFile::read_bytes(fp,(char *)local_42,2);
  iVar2 = (int)local_42[0];
  local_38 = (ulong)nlocals;
  pvVar4 = alloc_ext(this,nlocals,iVar2);
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  CVmFile::read_bytes(fp,(char *)local_42,5);
  CVmObjFixup::fix_dh(fixups,(char *)local_42);
  (pvVar4->entry).typ = (int)(char)local_42[0];
  vmb_get_dh_val((char *)local_42,&pvVar4->entry);
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  CVmFile::read_bytes(fp,(char *)local_42,5);
  CVmObjFixup::fix_dh(fixups,(char *)local_42);
  (pvVar4->self).typ = (int)(char)local_42[0];
  vmb_get_dh_val((char *)local_42,&pvVar4->self);
  CVmFile::read_bytes(fp,(char *)&local_3c,4);
  pvVar4->defobj = local_3c;
  if (local_3c != 0) {
    vVar3 = CVmObjFixup::get_new_id(fixups,local_3c);
    pvVar4->defobj = vVar3;
  }
  CVmFile::read_bytes(fp,(char *)&local_3c,4);
  pvVar4->targobj = local_3c;
  if (local_3c != 0) {
    vVar3 = CVmObjFixup::get_new_id(fixups,local_3c);
    pvVar4->targobj = vVar3;
  }
  CVmFile::read_bytes(fp,(char *)&local_3c,2);
  pvVar4->targprop = (vm_prop_id_t)local_3c;
  CVmFile::read_bytes(fp,(char *)local_42,5);
  CVmObjFixup::fix_dh(fixups,(char *)local_42);
  (pvVar4->invokee).typ = (int)(char)local_42[0];
  vmb_get_dh_val((char *)local_42,&pvVar4->invokee);
  iVar5 = (int)local_38;
  if (iVar2 + iVar5 != 0 && SCARRY4(iVar2,iVar5) == iVar2 + iVar5 < 0) {
    val = pvVar4->vars;
    iVar2 = iVar5 + iVar2 + 1;
    do {
      CVmFile::read_bytes(fp,(char *)local_42,5);
      CVmObjFixup::fix_dh(fixups,(char *)local_42);
      val->typ = (int)(char)local_42[0];
      vmb_get_dh_val((char *)local_42,val);
      val = val + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void CVmObjFrameRef::restore_from_file(VMG_ vm_obj_id_t self,
                                       class CVmFile *fp,
                                       class CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* read the variables counts */
    int nlocals = fp->read_int2();
    int nparams = fp->read_int2();

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive. 
     */
    get_ext()->fp = 0;

    /* load the entry pointer */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->entry);

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* restore the method context values */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->self);

    ext->defobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->defobj != VM_INVALID_OBJ)
        ext->defobj = fixups->get_new_id(vmg_ ext->defobj);
    
    ext->targobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->targobj != VM_INVALID_OBJ)
        ext->targobj = fixups->get_new_id(vmg_ ext->targobj);
    
    ext->targprop = (vm_prop_id_t)fp->read_uint2();

    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->invokee);

    /* load the snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, v);
    }
}